

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

WasmOp __thiscall
Wasm::WasmBinaryReader::ReadPrefixedOpCode
          (WasmBinaryReader *this,WasmOp prefix,bool isSupported,char16 *notSupportedMsg)

{
  uint32 *puVar1;
  byte *pbVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,isSupported) == 0) {
    ThrowDecodingError(this,notSupportedMsg);
  }
  pbVar2 = this->m_pc;
  if (*(int *)&this->m_end != (int)pbVar2) {
    puVar1 = &(this->m_funcState).count;
    *puVar1 = *puVar1 + 1;
    this->m_pc = pbVar2 + 1;
    return (ushort)*pbVar2 | prefix << 8;
  }
  ThrowDecodingError(this,L"Out of file: Needed: %d, Left: %d",1);
}

Assistant:

WasmOp WasmBinaryReader::ReadPrefixedOpCode(WasmOp prefix, bool isSupported, const char16* notSupportedMsg)
{
    CompileAssert(sizeof(WasmOp) >= 2);
    if (!isSupported)
    {
        ThrowDecodingError(notSupportedMsg);
    }
    CheckBytesLeft(1);
    ++m_funcState.count;
    return (WasmOp)((prefix << 8) | (*m_pc++));
}